

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base64.cpp
# Opt level: O0

maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> * __thiscall
anon_unknown.dwarf_eada::Base64Decode::convert
          (maybe<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           *__return_storage_ptr__,Base64Decode *this,string *source)

{
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  const_iterator this_00;
  const_iterator first;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> in_R8;
  undefined1 local_60 [8];
  maybe<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_void>
  oit;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> it;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  string *source_local;
  Base64Decode *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it);
  last._M_current =
       (char *)std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it);
  this_00 = std::begin<std::__cxx11::string>(source);
  first = std::end<std::__cxx11::string>(source);
  pstore::
  from_base64<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((maybe<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_void>
              *)local_60,(pstore *)this_00._M_current,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )first._M_current,last,in_R8);
  bVar1 = pstore::maybe::operator_cast_to_bool((maybe *)local_60);
  if (bVar1) {
    pstore::just<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
              (__return_storage_ptr__,(pstore *)&it,value);
  }
  else {
    pstore::nothing<std::vector<unsigned_char,std::allocator<unsigned_char>>>();
  }
  pstore::
  maybe<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_void>
  ::~maybe((maybe<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_void>
            *)local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it);
  return __return_storage_ptr__;
}

Assistant:

auto Base64Decode::convert (std::string const & source) const -> pstore::maybe<container> {
        std::vector<std::uint8_t> out;
        std::back_insert_iterator<container> it = std::back_inserter (out);
        pstore::maybe<decltype (it)> const oit =
            pstore::from_base64 (std::begin (source), std::end (source), it);
        if (oit) {
            return pstore::just (out);
        }
        return pstore::nothing<container> ();
    }